

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5DlidxIter * fts5DlidxIterInit(Fts5Index *p,int bRev,int iSegid,int iLeafPg)

{
  undefined8 *puVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Fts5DlidxIter *pFVar6;
  Fts5Data *pFVar7;
  Fts5DlidxIter *pIter;
  u64 nBytes;
  ulong uVar8;
  Fts5DlidxLvl *pFVar9;
  long lVar10;
  bool bVar11;
  
  if (p->rc == 0) {
    lVar10 = (long)iLeafPg + ((ulong)(uint)iSegid << 0x25) + 0x1000000000;
    iVar5 = 1;
    nBytes = 0x28;
    pIter = (Fts5DlidxIter *)0x0;
    do {
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        pFVar6 = (Fts5DlidxIter *)sqlite3Realloc(pIter,nBytes);
      }
      else {
        pFVar6 = (Fts5DlidxIter *)0x0;
      }
      if (pFVar6 == (Fts5DlidxIter *)0x0) {
        p->rc = 7;
        bVar3 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pFVar6->aLvl + (nBytes - 0x18));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pFVar6->aLvl + (nBytes - 0x28));
        *puVar1 = 0;
        puVar1[1] = 0;
        pFVar7 = fts5DataRead(p,lVar10);
        *(Fts5Data **)((long)pFVar6->aLvl + (nBytes - 0x28)) = pFVar7;
        if (pFVar7 == (Fts5Data *)0x0) {
          bVar3 = 0;
        }
        else {
          bVar3 = ~*pFVar7->p & 1;
        }
        pFVar6->nLvl = iVar5;
        pIter = pFVar6;
      }
      iVar5 = iVar5 + 1;
      nBytes = nBytes + 0x20;
      lVar10 = lVar10 + 0x80000000;
    } while (bVar3 == 0 && p->rc == 0);
    bVar11 = p->rc == 0;
  }
  else {
    pIter = (Fts5DlidxIter *)0x0;
    bVar11 = false;
  }
  if (bVar11) {
    pIter->iSegid = iSegid;
    uVar2 = pIter->nLvl;
    uVar8 = (ulong)uVar2;
    if (bRev == 0) {
      if (0 < (int)uVar2) {
        pFVar9 = pIter->aLvl;
        lVar10 = 0;
        do {
          fts5DlidxLvlNext(pFVar9);
          lVar10 = lVar10 + 1;
          pFVar9 = pFVar9 + 1;
        } while (lVar10 < pIter->nLvl);
      }
    }
    else if (0 < (int)uVar2) {
      do {
        pFVar9 = pIter->aLvl + (uVar8 - 1);
        do {
          iVar5 = fts5DlidxLvlNext(pFVar9);
        } while (iVar5 == 0);
        pFVar9->bEof = 0;
        if ((long)uVar8 < 2) break;
        sqlite3_free(pFVar9[-1].pData);
        pFVar9[-1].iFirstOff = 0;
        pFVar9[-1].iLeafPgno = 0;
        pFVar9[-1].iRowid = 0;
        pFVar9[-1].pData = (Fts5Data *)0x0;
        pFVar9[-1].iOff = 0;
        pFVar9[-1].bEof = 0;
        pFVar7 = fts5DataRead(p,(long)pFVar9->iLeafPgno + uVar8 * 0x80000000 +
                                ((ulong)(uint)pIter->iSegid << 0x25) + 0xf00000000);
        pFVar9[-1].pData = pFVar7;
        uVar8 = uVar8 - 1;
      } while (p->rc == 0);
    }
  }
  if (p->rc != 0) {
    fts5DlidxIterFree(pIter);
    pIter = (Fts5DlidxIter *)0x0;
  }
  return pIter;
}

Assistant:

static Fts5DlidxIter *fts5DlidxIterInit(
  Fts5Index *p,                   /* Fts5 Backend to iterate within */
  int bRev,                       /* True for ORDER BY ASC */
  int iSegid,                     /* Segment id */
  int iLeafPg                     /* Leaf page number to load dlidx for */
){
  Fts5DlidxIter *pIter = 0;
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    sqlite3_int64 nByte = sizeof(Fts5DlidxIter) + i * sizeof(Fts5DlidxLvl);
    Fts5DlidxIter *pNew;

    pNew = (Fts5DlidxIter*)sqlite3_realloc64(pIter, nByte);
    if( pNew==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      i64 iRowid = FTS5_DLIDX_ROWID(iSegid, i, iLeafPg);
      Fts5DlidxLvl *pLvl = &pNew->aLvl[i];
      pIter = pNew;
      memset(pLvl, 0, sizeof(Fts5DlidxLvl));
      pLvl->pData = fts5DataRead(p, iRowid);
      if( pLvl->pData && (pLvl->pData->p[0] & 0x0001)==0 ){
        bDone = 1;
      }
      pIter->nLvl = i+1;
    }
  }

  if( p->rc==SQLITE_OK ){
    pIter->iSegid = iSegid;
    if( bRev==0 ){
      fts5DlidxIterFirst(pIter);
    }else{
      fts5DlidxIterLast(p, pIter);
    }
  }

  if( p->rc!=SQLITE_OK ){
    fts5DlidxIterFree(pIter);
    pIter = 0;
  }

  return pIter;
}